

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment.cpp
# Opt level: O2

Alignment * __thiscall
jhu::thrax::readAlignment(Alignment *__return_storage_ptr__,thrax *this,string_view sv)

{
  pointer pPVar1;
  Alignment *pAVar2;
  char *pcVar3;
  size_type __n;
  long lVar4;
  invalid_argument *piVar5;
  ulong uVar6;
  char *__first;
  __normal_iterator<jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
  __i;
  pointer pPVar7;
  pointer pPVar8;
  allocator<char> local_71;
  Alignment *local_70;
  char *e;
  string_view sv_local;
  string local_50 [32];
  
  __first = (char *)sv._M_len;
  local_50[0] = (string)0x2d;
  sv_local._M_len = (size_t)this;
  sv_local._M_str = __first;
  __n = std::__count_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                  (__first,(char *)(this + (long)__first),(_Iter_equals_val<const_char>)local_50);
  std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&e);
  pPVar8 = (__return_storage_ptr__->
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (__return_storage_ptr__->
           super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_70 = __return_storage_ptr__;
  while( true ) {
    pAVar2 = local_70;
    if (pPVar8 == pPVar1) {
      pPVar8 = (local_70->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (local_70->super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pPVar8 != pPVar1) {
        uVar6 = (long)pPVar1 - (long)pPVar8 >> 2;
        lVar4 = 0x3f;
        if (uVar6 != 0) {
          for (; uVar6 >> lVar4 == 0; lVar4 = lVar4 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                  (pPVar8,pPVar1,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)pPVar1 - (long)pPVar8 < 0x41) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                    (pPVar8,pPVar1);
        }
        else {
          pPVar7 = pPVar8 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Iter_comp_iter<jhu::thrax::__0>>
                    (pPVar8,pPVar7);
          for (; pPVar7 != pPVar1; pPVar7 = pPVar7 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<jhu::thrax::Point*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,__gnu_cxx::__ops::_Val_comp_iter<jhu::thrax::__0>>
                      (pPVar7);
          }
        }
      }
      return pAVar2;
    }
    lVar4 = strtol(__first,&e,10);
    pcVar3 = e;
    pPVar8->src = (PointType)lVar4;
    if (e == __first) break;
    lVar4 = strtol(e,&e,10);
    pPVar8->tgt = -(short)lVar4;
    pPVar8 = pPVar8 + 1;
    __first = e;
    if (e == pcVar3) {
      piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (local_50,&sv_local,&local_71);
      std::invalid_argument::invalid_argument(piVar5,local_50);
      __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  piVar5 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_50,&sv_local,&local_71);
  std::invalid_argument::invalid_argument(piVar5,local_50);
  __cxa_throw(piVar5,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Alignment readAlignment(std::string_view sv) {
  Alignment result(std::count(sv.begin(), sv.end(), '-'));
  auto s = sv.data();
  char* e;
  for (auto& p : result) {
    p.src = std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
    p.tgt = -std::strtol(s, &e, 10);
    if (e == s) {
      throw std::invalid_argument(std::string(sv));
    }
    s = e;
  }
  std::sort(result.begin(), result.end(), bySource);
  return result;
}